

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf_v4::progressive(xr_ogf_v4 *this)

{
  ogf_model_type oVar1;
  xr_ogf_v4 *this_local;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  if (((oVar1 == MT3_PROGRESSIVE) || (oVar1 == MT3_SKELETON_ANIM)) || (oVar1 == MT3_LOD)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ogf_v4::progressive() const
{
	switch (m_model_type) {
	case MT4_PROGRESSIVE:
	case MT4_SKELETON_GEOMDEF_PM:
	case MT4_TREE_PM:
		return true;
	default:
		return false;
	}
}